

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

void minimalSwapAndFlipIVar_superFast_lessThen5
               (word *pInOut,int iVar,int nWords,char *pCanonPerm,uint *pCanonPhase)

{
  uint uVar1;
  uint jQ;
  uint uVar2;
  int start;
  uint iQ;
  uint kQ;
  uint lQ;
  int in_stack_ffffffffffffff70;
  int M [2];
  int DifStart4;
  int DifStart0;
  int DifStartMin;
  int DifStart1;
  
  DifStart4 = 0;
  uVar1 = minTemp0_fast(pInOut,iVar,nWords,&DifStart0);
  M[0] = uVar1;
  jQ = minTemp1_fast(pInOut,iVar,nWords,&DifStart1);
  M[1] = jQ;
  uVar2 = minTemp2_fast(pInOut,iVar,uVar1,jQ,nWords,&DifStartMin);
  if (DifStart0 == DifStart1) {
    if (DifStartMin < DifStart0) {
      start = DifStart0 / 100;
      uVar1 = minTemp3_fast(pInOut,iVar,start,DifStartMin / 100,uVar1 ^ 3,jQ ^ 3,&DifStart4);
      if (DifStartMin < DifStart4) {
        iQ = M[uVar1 ^ 1];
        uVar1 = M[uVar1];
      }
      else {
        iQ = M[uVar2];
        uVar1 = M[uVar2 ^ 1];
      }
      kQ = 3 - uVar1;
      lQ = 3 - iQ;
      goto LAB_004d10de;
    }
  }
  else if (DifStartMin < DifStart0 || DifStartMin < DifStart1) {
    start = DifStartMin / 100;
    if (DifStart1 < DifStart0) {
      if (start <= DifStart0 / 100) {
        start = DifStart0 / 100;
      }
      kQ = jQ ^ 3;
      lQ = uVar1 ^ 3;
      iQ = uVar1;
      uVar1 = jQ;
    }
    else {
      if (start <= DifStart1 / 100) {
        start = DifStart1 / 100;
      }
      kQ = uVar1 ^ 3;
      lQ = jQ ^ 3;
      iQ = jQ;
    }
    goto LAB_004d10de;
  }
  start = DifStartMin / 100;
  kQ = 3 - M[uVar2 ^ 1];
  lQ = 3 - M[uVar2];
  iQ = M[uVar2];
  uVar1 = M[uVar2 ^ 1];
LAB_004d10de:
  arrangeQuoters_superFast_lessThen5
            (pInOut,start,iQ,uVar1,kQ,lQ,iVar,in_stack_ffffffffffffff70,pCanonPerm,pCanonPhase);
  return;
}

Assistant:

void minimalSwapAndFlipIVar_superFast_lessThen5(word* pInOut, int iVar, int nWords, char * pCanonPerm, unsigned* pCanonPhase)
{
    int min1, min2, DifStart0, DifStart1, DifStartMin, DifStart4=0;
    int M[2];   
    M[0] = minTemp0_fast(pInOut, iVar, nWords, &DifStart0); // 0, 3
    M[1] = minTemp1_fast(pInOut, iVar, nWords, &DifStart1); // 1, 2
    min1 = minTemp2_fast(pInOut, iVar, M[0], M[1], nWords, &DifStartMin);
//     printf("\nDifStart0 = %d, DifStart1 = %d, DifStartMin = %d\n",DifStart0, DifStart1, DifStartMin);
//     printf("M[0] = %d, M[1] = %d, min1 = %d\n", M[0], M[1], min1);
    if(DifStart0 != DifStart1)
    {
//         printf("if\n");
        if( DifStartMin>=DifStart1 && DifStartMin>=DifStart0 )
            arrangeQuoters_superFast_lessThen5(pInOut, DifStartMin/100, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, nWords, pCanonPerm, pCanonPhase);
        else if( DifStart0 > DifStart1)
            arrangeQuoters_superFast_lessThen5(pInOut,luckyMax(DifStartMin/100, DifStart0/100), M[0], M[1], 3 - M[1], 3 - M[0], iVar, nWords, pCanonPerm, pCanonPhase);
        else
            arrangeQuoters_superFast_lessThen5(pInOut,luckyMax(DifStartMin/100, DifStart1/100), M[1], M[0], 3 - M[0], 3 - M[1], iVar, nWords, pCanonPerm, pCanonPhase);
    }
    else
    {
//         printf("else\n");
        if(DifStartMin>=DifStart0)
            arrangeQuoters_superFast_lessThen5(pInOut, DifStartMin/100, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, nWords, pCanonPerm, pCanonPhase);
        else
        {
            min2 = minTemp3_fast(pInOut, iVar, DifStart0/100, DifStartMin/100, 3-M[0], 3-M[1], &DifStart4);  // no reuse DifStart1 because DifStart1 = DifStart1=0
//             printf("after minTemp3_fast min2 = %d, DifStart4 = %d\n", min2, DifStart4);
            if(DifStart4>DifStartMin)
                arrangeQuoters_superFast_lessThen5(pInOut, DifStart0/100, M[(min2+1)&1], M[min2], 3 - M[min2], 3 - M[(min2+1)&1], iVar, nWords, pCanonPerm, pCanonPhase);
            else
                arrangeQuoters_superFast_lessThen5(pInOut, DifStart0/100, M[min1], M[(min1+1)&1], 3 - M[(min1+1)&1], 3 - M[min1], iVar, nWords, pCanonPerm, pCanonPhase);
        }
    }
}